

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.c
# Opt level: O0

int dsa_pubkey_bits(ssh_keyalg *self,ptrlen pub)

{
  ssh_key *key;
  size_t sVar1;
  int ret;
  dsa_key *dsa;
  ssh_key *sshk;
  ssh_keyalg *self_local;
  ptrlen pub_local;
  
  key = dsa_new_pub(self,pub);
  if (key == (ssh_key *)0x0) {
    pub_local.len._4_4_ = -1;
  }
  else {
    sVar1 = mp_get_nbits((mp_int *)key[-5].vt);
    pub_local.len._4_4_ = (int)sVar1;
    dsa_freekey(key);
  }
  return pub_local.len._4_4_;
}

Assistant:

static int dsa_pubkey_bits(const ssh_keyalg *self, ptrlen pub)
{
    ssh_key *sshk;
    struct dsa_key *dsa;
    int ret;

    sshk = dsa_new_pub(self, pub);
    if (!sshk)
        return -1;

    dsa = container_of(sshk, struct dsa_key, sshk);
    ret = mp_get_nbits(dsa->p);
    dsa_freekey(&dsa->sshk);

    return ret;
}